

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O3

Float __thiscall
pbrt::BVHLightSampler::EvaluateCost(BVHLightSampler *this,LightBounds *b,Bounds3f *bounds,int dim)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 extraout_var [60];
  
  fVar6 = acosf(b->cosTheta_o);
  fVar7 = acosf(b->cosTheta_e);
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416((uint)(fVar6 + fVar7)));
  fVar7 = b->cosTheta_o;
  auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar1,ZEXT416((uint)fVar6));
  auVar8._0_4_ = cosf(auVar5._0_4_);
  auVar8._4_60_ = extraout_var;
  fVar2 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
          (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y -
          (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  fVar4 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z -
          (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  fVar10 = fVar2;
  if ((dim != 0) && (fVar10 = fVar3, dim != 1)) {
    fVar10 = fVar4;
  }
  auVar5 = vmaxss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2));
  auVar5 = vmaxss_avx(ZEXT416((uint)fVar4),auVar5);
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar7 * fVar7)),auVar11);
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  auVar1 = vfmsub213ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar1._0_4_)),auVar11,auVar8._0_16_);
  auVar1 = vfmadd231ss_fma(auVar1,auVar11,ZEXT416((uint)(fVar6 * -2.0)));
  fVar2 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z -
          (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
  fVar3 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x -
          (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)((b->cosTheta_o + auVar1._0_4_) * 1.5707964)),
                           ZEXT416((uint)(1.0 - fVar7)),ZEXT416(0x40c90fdb));
  auVar9 = ZEXT416((uint)((b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y -
                         (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar2)),auVar9,ZEXT416((uint)fVar3));
  auVar11 = vfmadd231ss_fma(auVar11,auVar9,ZEXT416((uint)fVar2));
  return (auVar5._0_4_ / fVar10) * auVar1._0_4_ * b->phi * (auVar11._0_4_ + auVar11._0_4_);
}

Assistant:

Float EvaluateCost(const LightBounds &b, const Bounds3f &bounds, int dim) const {
        // Evaluate direction bounds measure for _LightBounds_
        Float theta_o = std::acos(b.cosTheta_o), theta_e = std::acos(b.cosTheta_e);
        Float theta_w = std::min(theta_o + theta_e, Pi);
        Float sinTheta_o = SafeSqrt(1 - Sqr(b.cosTheta_o));
        Float Momega = 2 * Pi * (1 - b.cosTheta_o) +
                       Pi / 2 *
                           (2 * theta_w * sinTheta_o - std::cos(theta_o - 2 * theta_w) -
                            2 * theta_o * sinTheta_o + b.cosTheta_o);

        // Return complete cost estimate for _LightBounds_
        Float Kr = MaxComponentValue(bounds.Diagonal()) / bounds.Diagonal()[dim];
        return b.phi * Momega * Kr * b.bounds.SurfaceArea();
    }